

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

DispatchCallResult __thiscall
capnp::Capability::Server::internalUnimplemented
          (Server *this,char *interfaceName,uint64_t typeId,uint16_t methodId)

{
  undefined6 in_register_0000000a;
  undefined8 extraout_RDX;
  undefined2 in_R8W;
  DispatchCallResult DVar1;
  undefined6 uStack_1d8;
  uint16_t methodId_local;
  Array<char> local_1d0;
  uint64_t typeId_local;
  char *interfaceName_local;
  Exception local_1a8;
  
  typeId_local = CONCAT62(in_register_0000000a,methodId);
  interfaceName_local = (char *)typeId;
  kj::_::Debug::makeDescription<char_const(&)[24],char_const*&,unsigned_long&,unsigned_short&>
            ((String *)&local_1d0,
             (Debug *)"\"Method not implemented.\", interfaceName, typeId, methodId",
             "Method not implemented.",(char (*) [24])&interfaceName_local,(char **)&typeId_local,
             (unsigned_long *)&methodId_local,(unsigned_short *)CONCAT26(in_R8W,uStack_1d8));
  kj::Exception::Exception
            (&local_1a8,UNIMPLEMENTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
             ,100,(String *)&local_1d0);
  kj::Promise<void>::Promise((Promise<void> *)this,&local_1a8);
  *(undefined2 *)&(this->thisHook).ptr = 0x100;
  kj::Exception::~Exception(&local_1a8);
  kj::Array<char>::~Array(&local_1d0);
  DVar1.isStreaming = (bool)(char)extraout_RDX;
  DVar1.allowCancellation = (bool)(char)((ulong)extraout_RDX >> 8);
  DVar1._10_6_ = (int6)((ulong)extraout_RDX >> 0x10);
  DVar1.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar1;
}

Assistant:

Capability::Server::DispatchCallResult Capability::Server::internalUnimplemented(
    const char* interfaceName, uint64_t typeId, uint16_t methodId) {
  return {
    KJ_EXCEPTION(UNIMPLEMENTED, "Method not implemented.", interfaceName, typeId, methodId),
    false, true
  };
}